

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCRgbaFile.cpp
# Opt level: O3

int ImfHeaderSetM44fAttribute(ImfHeader *hdr,char *name,float (*m) [4])

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  Iterator IVar9;
  iterator iVar10;
  TypedAttribute<Imath_3_2::Matrix44<float>_> *pTVar11;
  Matrix44<float> local_a8;
  TypedAttribute<Imath_3_2::Matrix44<float>_> local_60;
  
  uVar1 = *(undefined8 *)*m;
  uVar2 = *(undefined8 *)(*m + 2);
  uVar3 = *(undefined8 *)m[1];
  uVar4 = *(undefined8 *)(m[1] + 2);
  uVar5 = *(undefined8 *)m[2];
  uVar6 = *(undefined8 *)(m[2] + 2);
  uVar7 = *(undefined8 *)m[3];
  uVar8 = *(undefined8 *)(m[3] + 2);
  local_a8.x[0]._0_8_ = uVar1;
  local_a8.x[0]._8_8_ = uVar2;
  local_a8.x[1]._0_8_ = uVar3;
  local_a8.x[1]._8_8_ = uVar4;
  local_a8.x[2]._0_8_ = uVar5;
  local_a8.x[2]._8_8_ = uVar6;
  local_a8.x[3]._0_8_ = uVar7;
  local_a8.x[3]._8_8_ = uVar8;
  IVar9 = Imf_3_4::Header::find((Header *)hdr,name);
  iVar10._M_node = (_Base_ptr)Imf_3_4::Header::end((Header *)hdr);
  if (IVar9._i._M_node == (iterator)iVar10._M_node) {
    Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>_>::TypedAttribute(&local_60,&local_a8);
    Imf_3_4::Header::insert((Header *)hdr,name,&local_60.super_Attribute);
    Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>_>::~TypedAttribute(&local_60);
  }
  else {
    pTVar11 = Imf_3_4::Header::typedAttribute<Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>>>
                        ((Header *)hdr,name);
    *(undefined8 *)(pTVar11->_value).x[0] = uVar1;
    *(undefined8 *)((pTVar11->_value).x[0] + 2) = uVar2;
    *(undefined8 *)(pTVar11->_value).x[1] = uVar3;
    *(undefined8 *)((pTVar11->_value).x[1] + 2) = uVar4;
    *(undefined8 *)(pTVar11->_value).x[2] = uVar5;
    *(undefined8 *)((pTVar11->_value).x[2] + 2) = uVar6;
    *(undefined8 *)(pTVar11->_value).x[3] = uVar7;
    *(undefined8 *)((pTVar11->_value).x[3] + 2) = uVar8;
  }
  return 1;
}

Assistant:

int
ImfHeaderSetM44fAttribute (
    ImfHeader* hdr, const char name[], const float m[4][4])
{
    try
    {
        M44f m4 (m);

        if (header (hdr)->find (name) == header (hdr)->end ())
            header (hdr)->insert (
                name, OPENEXR_IMF_INTERNAL_NAMESPACE::M44fAttribute (m4));
        else
            header (hdr)
                ->typedAttribute<
                    OPENEXR_IMF_INTERNAL_NAMESPACE::M44fAttribute> (name)
                .value () = m4;

        return 1;
    }
    catch (const std::exception& e)
    {
        setErrorMessage (e);
        return 0;
    }
}